

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall Omega_h::linearize_metrics_dim<1>(Omega_h *this,Reals *metrics)

{
  int *piVar1;
  Alloc *pAVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  LO size_in;
  size_t sVar6;
  Reals RVar7;
  Write<double> out;
  type f;
  Write<double> local_68;
  string local_50;
  Write<double> local_30;
  
  pAVar2 = (metrics->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar6 = pAVar2->size;
  }
  else {
    sVar6 = (ulong)pAVar2 >> 3;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  size_in = (LO)(sVar6 >> 3);
  Write<double>::Write(&local_68,size_in,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_50._M_dataplus._M_p = (pointer)((local_68.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50._M_string_length = (size_type)local_68.shared_alloc_.direct_ptr;
  local_50.field_2._M_allocated_capacity = (size_type)(metrics->write_).shared_alloc_.alloc;
  if ((local_50.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_50.field_2._M_allocated_capacity != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.field_2._M_allocated_capacity =
           ((Alloc *)local_50.field_2._M_allocated_capacity)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_50.field_2._M_allocated_capacity)->use_count =
           ((Alloc *)local_50.field_2._M_allocated_capacity)->use_count + 1;
    }
  }
  local_50.field_2._8_8_ = (metrics->write_).shared_alloc_.direct_ptr;
  parallel_for<Omega_h::linearize_metrics_dim<1>(Omega_h::Read<double>)::_lambda(int)_1_>
            (size_in,(type *)&local_50,"linearize_metrics");
  local_30.shared_alloc_.alloc = local_68.shared_alloc_.alloc;
  local_30.shared_alloc_.direct_ptr = local_68.shared_alloc_.direct_ptr;
  if ((((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
       local_68.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + -1;
    local_30.shared_alloc_.alloc = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_68.shared_alloc_.alloc = (Alloc *)0x0;
  local_68.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_30);
  pAVar2 = local_30.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_30.shared_alloc_.alloc & 7) == 0 && local_30.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_30.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  uVar4 = local_50.field_2._M_allocated_capacity;
  if ((local_50.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_50.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar1 = (int *)(local_50.field_2._M_allocated_capacity + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_50.field_2._M_allocated_capacity);
      operator_delete((void *)uVar4,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  _Var3._M_p = local_50._M_dataplus._M_p;
  if (((ulong)local_50._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_50._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_50._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_50._M_dataplus._M_p);
      operator_delete(_Var3._M_p,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  pAVar2 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_03;
    }
  }
  RVar7.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar7.write_.shared_alloc_;
}

Assistant:

Reals linearize_metrics_dim(Reals metrics) {
  auto n = divide_no_remainder(metrics.size(), symm_ncomps(dim));
  auto out = Write<Real>(n * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_symm(out, i, linearize_metric(get_symm<dim>(metrics, i)));
  };
  parallel_for(n, f, "linearize_metrics");
  return out;
}